

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O2

void expr_ff(t_expr *x)

{
  _exprproxy *x_00;
  long lVar1;
  
  while (x_00 = x->exp_proxy, x_00 != (_exprproxy *)0x0) {
    x->exp_proxy = x_00->p_next;
    pd_free(&x_00->p_pd);
  }
  for (lVar1 = 0; lVar1 < x->exp_nexpr; lVar1 = lVar1 + 1) {
    free(x->exp_stack[lVar1]);
  }
  for (lVar1 = -800; lVar1 != 0; lVar1 = lVar1 + 8) {
    free(*(void **)((long)x->exp_p_res + lVar1));
    free(*(void **)((long)x->exp_tmpres + lVar1));
    free(*(void **)((long)&x->exp_vsize + lVar1));
  }
  return;
}

Assistant:

static void
expr_ff(t_expr *x)
{
        t_exprproxy *y;
        int i;

        y = x->exp_proxy;
        while (y)
        {
                x->exp_proxy = y->p_next;
#ifdef PD
                pd_free(&y->p_pd);
#else /*MSP */
        /* SDY find out what needs to be called for MSP */

#endif
                y = x->exp_proxy;
        }
        for (i = 0 ; i < x->exp_nexpr; i++)
                if (x->exp_stack[i])
                        fts_free(x->exp_stack[i]);
/*
 * SDY free all the allocated buffers here for expr~ and fexpr~
 * check to see if there are others
 */
        for (i = 0; i < MAX_VARS; i++) {
                if (x->exp_p_var[i])
                        fts_free(x->exp_p_var[i]);
                if (x->exp_p_res[i])
                        fts_free(x->exp_p_res[i]);
                if (x->exp_tmpres[i])
                        fts_free(x->exp_tmpres[i]);
        }


}